

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object __thiscall
pybind11::detail::accessor_policies::generic_item::get(generic_item *this,handle obj,handle key)

{
  PyObject *pPVar1;
  PyObject **ppPVar2;
  error_already_set *this_00;
  handle local_40 [3];
  PyObject *local_28;
  PyObject *result;
  handle key_local;
  handle obj_local;
  
  result = key.m_ptr;
  key_local = obj;
  ppPVar2 = handle::ptr(&key_local);
  pPVar1 = *ppPVar2;
  ppPVar2 = handle::ptr((handle *)&result);
  local_28 = (PyObject *)PyObject_GetItem(pPVar1,*ppPVar2);
  if (local_28 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(local_40,local_28);
  reinterpret_steal<pybind11::object>((pybind11 *)this,local_40[0]);
  return (object)(handle)this;
}

Assistant:

static object get(handle obj, handle key) {
        PyObject *result = PyObject_GetItem(obj.ptr(), key.ptr());
        if (!result) { throw error_already_set(); }
        return reinterpret_steal<object>(result);
    }